

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O1

void __thiscall hwnet::TCPSocket::Do(TCPSocket *this)

{
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *this_00;
  _List_node_base *p_Var1;
  Poller *this_01;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  _Manager_operation extraout_EDX;
  iterator __position;
  mutex *__mutex;
  uint uVar6;
  byte bVar7;
  undefined1 auStack_78 [8];
  value_type front;
  void *pvStack_50;
  
  __mutex = &this->mtx;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 == 0) {
    this_00 = &this->closures;
    bVar3 = false;
    uVar6 = 0;
    do {
      p_Var1 = (this_00->
               super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>).
               _M_impl._M_node.super__List_node_base._M_next;
      if (p_Var1 != (_List_node_base *)this_00) {
        std::function<void_()>::function
                  ((function<void_()> *)auStack_78,(function<void_()> *)(p_Var1 + 1));
        __position._M_node =
             (this_00->
             super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>).
             _M_impl._M_node.super__List_node_base._M_next;
        std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
        _M_erase(this_00,__position);
        if (front.super__Function_base._M_functor._8_8_ == 0) {
          std::__throw_bad_function_call();
        }
        (*front.super__Function_base._M_manager)
                  ((_Any_data *)auStack_78,(_Any_data *)__position._M_node,extraout_EDX);
        if (front.super__Function_base._M_functor._8_8_ != 0) {
          (*(code *)front.super__Function_base._M_functor._8_8_)
                    ((_Any_data *)auStack_78,(_Any_data *)auStack_78,3);
        }
      }
      if ((this->readable != true) ||
         (bVar7 = 1,
         (this->recvList).
         super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
         ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&this->recvList)) {
        bVar7 = this->socketError;
      }
      bVar4 = canWrite(this);
      if (((bVar7 | bVar4) == 1) && (((this->closed)._M_base._M_i & 1U) == 0)) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if (uVar6 < 10) {
          if (bVar7 != 0) {
            recvInWorker(this);
          }
          bVar2 = true;
          if (bVar4) {
            sendInWorker(this);
          }
        }
        else {
          this_01 = this->poller_;
          std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<hwnet::TCPSocket,void>
                    ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&front._M_invoker,
                     (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                     &this->super_enable_shared_from_this<hwnet::TCPSocket>);
          auStack_78 = (undefined1  [8])front._M_invoker;
          front.super__Function_base._M_functor._M_unused._M_object = pvStack_50;
          front._M_invoker = (_Invoker_type)0x0;
          pvStack_50 = (void *)0x0;
          Poller::PostTask(this_01,(Ptr *)auStack_78,this->pool_);
          if (front.super__Function_base._M_functor._M_unused._M_object != (void *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       front.super__Function_base._M_functor._M_unused._0_8_);
          }
          bVar2 = false;
        }
      }
      else {
        bVar4 = true;
        if (((this->closed)._M_base._M_i & 1U) == 0) {
          this->doing = false;
          bVar4 = bVar3;
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        if (bVar4) {
          doClose(this);
        }
        bVar2 = false;
        bVar3 = bVar4;
      }
      if (!bVar2) {
        return;
      }
      uVar6 = uVar6 + 1;
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    } while (iVar5 == 0);
  }
  std::__throw_system_error(iVar5);
}

Assistant:

void TCPSocket::Do() {
	static const int maxLoop = 10;
	auto doClose = false;	
	//this->tid = std::this_thread::get_id();
	auto i = 0;
	for( ;;i++) {
		this->mtx.lock();
		if(!this->closures.empty()) {
			auto front = this->closures.front();
			this->closures.pop_front();
			front();
		}

		auto canRead_ = canRead();
		auto canWrite_ = canWrite();
		if(!(canRead_ || canWrite_) || this->closed) {
			if(!closed) {
				this->doing =false;
			} else {
				doClose = true;
			}
			this->mtx.unlock();
			if(doClose){
				this->doClose();
			}
			//this->tid = std::thread::id();
			return;
		}
		this->mtx.unlock();
		if(i >= maxLoop){
			//执行次数过多了，暂停一下，将cpu让给其它任务执行
			//this->tid = std::thread::id();
			poller_->PostTask(shared_from_this(),this->pool_);
			return;
		} else {


			if(canRead_){
				recvInWorker();
			}

#ifdef USE_SSL
			if(canWrite_){
				sendInWorkerSSL();
			}
#else
			if(canWrite_){
				sendInWorker();
			}
#endif

		}
	}
}